

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O1

void __thiscall
cppcms::session_interface::set_session_cookie
          (session_interface *this,int64_t age,string *data,string *key)

{
  bool bVar1;
  bool bVar2;
  bool secure;
  bool httponly;
  bool v;
  bool v_00;
  bool v_01;
  size_type sVar3;
  pointer pcVar4;
  session_interface_cookie_adapter *psVar5;
  cached_settings *pcVar6;
  cached_settings *pcVar7;
  cached_settings *pcVar8;
  time_t tVar9;
  response *this_00;
  ulong uVar10;
  time_t when;
  string cookie_name;
  cookie the_cookie;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  long local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  cookie local_f0;
  
  sVar3 = data->_M_string_length;
  pcVar6 = cached_settings(this);
  local_1b8 = local_1a8;
  pcVar4 = (pcVar6->session).cookies.prefix._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar4,pcVar4 + (pcVar6->session).cookies.prefix._M_string_length)
  ;
  if (key->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)(key->_M_dataplus)._M_p);
  }
  pcVar6 = cached_settings(this);
  pcVar7 = cached_settings(this);
  pcVar8 = cached_settings(this);
  local_198 = (long)(pcVar8->session).cookies.time_shift;
  pcVar8 = cached_settings(this);
  bVar1 = (pcVar8->session).cookies.use_age;
  pcVar8 = cached_settings(this);
  bVar2 = (pcVar8->session).cookies.use_exp;
  pcVar8 = cached_settings(this);
  secure = (pcVar8->session).cookies.secure;
  pcVar8 = cached_settings(this);
  httponly = (pcVar8->session).cookies.httponly;
  pcVar8 = cached_settings(this);
  v = (pcVar8->session).cookies.use_samesite_none;
  pcVar8 = cached_settings(this);
  v_00 = (pcVar8->session).cookies.use_samesite_lax;
  pcVar8 = cached_settings(this);
  v_01 = (pcVar8->session).cookies.use_samesite_strict;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_1b8,local_1b8 + local_1b0);
  util::urlencode(&local_110,data);
  pcVar4 = (pcVar7->session).cookies.path._M_dataplus._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar4,pcVar4 + (pcVar7->session).cookies.path._M_string_length);
  pcVar4 = (pcVar6->session).cookies.domain._M_dataplus._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar4,pcVar4 + (pcVar6->session).cookies.domain._M_string_length)
  ;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  http::cookie::cookie(&local_f0,&local_190,&local_110,&local_150,&local_170,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  uVar10 = -(ulong)(sVar3 == 0) | age;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((long)uVar10 < 0) {
    if (bVar1 != false) {
      http::cookie::max_age(&local_f0,0);
    }
    when = 1;
    if (bVar2 == false) goto LAB_00213381;
  }
  else {
    if (uVar10 == 0) {
      http::cookie::browser_age(&local_f0);
      goto LAB_00213381;
    }
    if (bVar1 != false) {
      http::cookie::max_age(&local_f0,(uint)uVar10);
    }
    if (bVar2 == false) goto LAB_00213381;
    tVar9 = time((time_t *)0x0);
    when = uVar10 + local_198 + tVar9;
  }
  http::cookie::expires(&local_f0,when);
LAB_00213381:
  http::cookie::secure(&local_f0,secure);
  http::cookie::httponly(&local_f0,httponly);
  http::cookie::samesite_none(&local_f0,v);
  http::cookie::samesite_lax(&local_f0,v_00);
  http::cookie::samesite_strict(&local_f0,v_01);
  psVar5 = ((this->d).ptr_)->adapter;
  if (psVar5 == (session_interface_cookie_adapter *)0x0) {
    this_00 = http::context::response(this->context_);
    http::response::set_cookie(this_00,&local_f0);
  }
  else {
    (*psVar5->_vptr_session_interface_cookie_adapter[2])(psVar5,&local_f0);
  }
  http::cookie::~cookie(&local_f0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  return;
}

Assistant:

void session_interface::set_session_cookie(int64_t age,std::string const &data,std::string const &key)
{
	if(data.empty())
		age=-1;
	std::string cookie_name=cached_settings().session.cookies.prefix;
	if(!key.empty()) {
		cookie_name+="_";
		cookie_name+=key;
	}
	std::string const &domain = cached_settings().session.cookies.domain;
	std::string const &path   = cached_settings().session.cookies.path;
	int time_shift = cached_settings().session.cookies.time_shift;
	bool use_age = cached_settings().session.cookies.use_age;
	bool use_exp = cached_settings().session.cookies.use_exp;

	bool secure = cached_settings().session.cookies.secure;
	bool httponly = cached_settings().session.cookies.httponly;
	bool use_samesite_none = cached_settings().session.cookies.use_samesite_none;
	bool use_samesite_lax = cached_settings().session.cookies.use_samesite_lax;
	bool use_samesite_strict = cached_settings().session.cookies.use_samesite_strict;

	http::cookie the_cookie(cookie_name,util::urlencode(data),path,domain);

	if(age < 0) {
		if(use_age)
			the_cookie.max_age(0);
		if(use_exp)
			the_cookie.expires(1);
	}
	else if(age == 0) {
		the_cookie.browser_age();
	}
	else {
		if(use_age)
			the_cookie.max_age(age);
		if(use_exp) {
			the_cookie.expires(age + time(0) + time_shift);
		}
	}

	the_cookie.secure(secure);
	the_cookie.httponly(httponly);
	the_cookie.samesite_none(use_samesite_none);
	the_cookie.samesite_lax(use_samesite_lax);
	the_cookie.samesite_strict(use_samesite_strict);
	
	if(d->adapter)
		d->adapter->set_cookie(the_cookie);
	else
		context_->response().set_cookie(the_cookie);
}